

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_verify(secp256k1_fe *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint64_t uVar64;
  uint64_t uVar65;
  uint64_t uVar66;
  uint64_t uVar67;
  uint64_t *puVar68;
  uint64_t *puVar69;
  uint64_t *puVar70;
  int iVar71;
  int iVar72;
  uint extraout_EAX;
  uint uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  secp256k1_gej *a_00;
  secp256k1_fe *a_01;
  ulong uVar78;
  secp256k1_gej *in_RSI;
  secp256k1_gej *a_02;
  ulong uVar79;
  bool bVar80;
  secp256k1_gej *r;
  ulong uVar81;
  long lVar82;
  ulong uVar83;
  ulong uVar84;
  secp256k1_gej *psVar85;
  
  uVar77 = (ulong)(uint)a->magnitude;
  if (uVar77 < 0x21) {
    uVar73 = a->normalized;
    if (1 < uVar73) goto LAB_00118422;
    if (uVar73 == 0) {
LAB_00118396:
      lVar82 = uVar77 * 2;
    }
    else {
      lVar82 = 1;
      if (1 < (uint)a->magnitude) {
        secp256k1_fe_verify_cold_1();
        uVar73 = extraout_EAX;
        goto LAB_00118396;
      }
    }
    puVar68 = a->n;
    psVar85 = (secp256k1_gej *)((lVar82 << 0x34) - lVar82);
    if (psVar85 < (secp256k1_gej *)*puVar68) goto LAB_00118427;
    puVar69 = a->n;
    if (psVar85 < (secp256k1_gej *)puVar69[1]) goto LAB_0011842c;
    in_RSI = (secp256k1_gej *)a->n[2];
    if (psVar85 < in_RSI) goto LAB_00118431;
    puVar70 = a->n;
    if (psVar85 < (secp256k1_gej *)puVar70[3]) goto LAB_00118436;
    a = (secp256k1_fe *)a->n[4];
    if ((secp256k1_fe *)((lVar82 << 0x30) - lVar82) < a) goto LAB_0011843b;
    bVar80 = a != (secp256k1_fe *)0xffffffffffff || uVar73 == 0;
    a = (secp256k1_fe *)CONCAT71((int7)((ulong)a >> 8),bVar80);
    if (((bVar80) || ((secp256k1_gej *)*puVar68 < (secp256k1_gej *)0xffffefffffc2f)) ||
       (in_RSI = (secp256k1_gej *)((ulong)in_RSI & (ulong)puVar69[1] & (ulong)puVar70[3]),
       in_RSI != (secp256k1_gej *)0xfffffffffffff)) {
      return;
    }
  }
  else {
    secp256k1_fe_verify_cold_9();
LAB_00118422:
    secp256k1_fe_verify_cold_8();
LAB_00118427:
    secp256k1_fe_verify_cold_7();
LAB_0011842c:
    secp256k1_fe_verify_cold_6();
LAB_00118431:
    secp256k1_fe_verify_cold_5();
LAB_00118436:
    secp256k1_fe_verify_cold_4();
LAB_0011843b:
    secp256k1_fe_verify_cold_3();
  }
  secp256k1_fe_verify_cold_2();
  secp256k1_fe_verify(a);
  psVar85 = (secp256k1_gej *)(a + 1);
  secp256k1_fe_verify((secp256k1_fe *)psVar85);
  if ((uint)a[2].n[0] < 2) {
    return;
  }
  secp256k1_ge_verify_cold_1();
  a_02 = in_RSI;
  secp256k1_fe_verify(&in_RSI->x);
  r = a_00;
  secp256k1_fe_verify(&a_00->x);
  if ((in_RSI->x).magnitude < 9) {
    if (8 < (a_00->x).magnitude) goto LAB_001187d8;
    if (psVar85 != a_00) {
      if (in_RSI != a_00) {
        uVar77 = (in_RSI->x).n[0];
        uVar84 = (in_RSI->x).n[1];
        uVar78 = (in_RSI->x).n[2];
        uVar79 = (in_RSI->x).n[3];
        uVar81 = (in_RSI->x).n[4];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (a_00->x).n[0];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar79;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (a_00->x).n[1];
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar78;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (a_00->x).n[2];
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar84;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (a_00->x).n[3];
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar77;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (a_00->x).n[4];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar81;
        uVar74 = SUB168(auVar5 * auVar35,0);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar74 & 0xfffffffffffff;
        auVar1 = auVar2 * auVar32 + auVar1 * auVar31 + auVar3 * auVar33 + auVar4 * auVar34 +
                 auVar6 * ZEXT816(0x1000003d10);
        uVar75 = auVar1._0_8_;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar75 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (a_00->x).n[0];
        auVar36._8_8_ = 0;
        auVar36._0_8_ = uVar81;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (a_00->x).n[1];
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar79;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (a_00->x).n[2];
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar78;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = (a_00->x).n[3];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar84;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = (a_00->x).n[4];
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar77;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar74 >> 0x34 | SUB168(auVar5 * auVar35,8) << 0xc;
        auVar1 = auVar7 * auVar36 + auVar57 + auVar8 * auVar37 + auVar9 * auVar38 +
                 auVar10 * auVar39 + auVar11 * auVar40 + auVar12 * ZEXT816(0x1000003d10);
        uVar74 = auVar1._0_8_;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar74 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = (a_00->x).n[0];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar77;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = (a_00->x).n[1];
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar81;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = (a_00->x).n[2];
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar79;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = (a_00->x).n[3];
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar78;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = (a_00->x).n[4];
        auVar45._8_8_ = 0;
        auVar45._0_8_ = uVar84;
        auVar1 = auVar14 * auVar42 + auVar58 + auVar15 * auVar43 + auVar16 * auVar44 +
                 auVar17 * auVar45;
        uVar76 = auVar1._0_8_;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = uVar76 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = (uVar76 & 0xfffffffffffff) << 4 | (uVar74 & 0xfffffffffffff) >> 0x30;
        auVar1 = auVar13 * auVar41 + ZEXT816(0x1000003d1) * auVar46;
        uVar76 = auVar1._0_8_;
        (psVar85->x).n[0] = uVar76 & 0xfffffffffffff;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = uVar76 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = (a_00->x).n[0];
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar84;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = (a_00->x).n[1];
        auVar48._8_8_ = 0;
        auVar48._0_8_ = uVar77;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = (a_00->x).n[2];
        auVar49._8_8_ = 0;
        auVar49._0_8_ = uVar81;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = (a_00->x).n[3];
        auVar50._8_8_ = 0;
        auVar50._0_8_ = uVar79;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = (a_00->x).n[4];
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar78;
        auVar2 = auVar20 * auVar49 + auVar60 + auVar21 * auVar50 + auVar22 * auVar51;
        uVar76 = auVar2._0_8_;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar76 & 0xfffffffffffff;
        auVar1 = auVar18 * auVar47 + auVar59 + auVar19 * auVar48 + auVar23 * ZEXT816(0x1000003d10);
        uVar83 = auVar1._0_8_;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = uVar76 >> 0x34 | auVar2._8_8_ << 0xc;
        (psVar85->x).n[1] = uVar83 & 0xfffffffffffff;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = uVar83 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = (a_00->x).n[0];
        auVar52._8_8_ = 0;
        auVar52._0_8_ = uVar78;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = (a_00->x).n[1];
        auVar53._8_8_ = 0;
        auVar53._0_8_ = uVar84;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = (a_00->x).n[2];
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar77;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = (a_00->x).n[3];
        auVar55._8_8_ = 0;
        auVar55._0_8_ = uVar81;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = (a_00->x).n[4];
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar79;
        auVar2 = auVar27 * auVar55 + auVar62 + auVar28 * auVar56;
        uVar77 = auVar2._0_8_;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar77 & 0xfffffffffffff;
        auVar1 = auVar24 * auVar52 + auVar61 + auVar25 * auVar53 + auVar26 * auVar54 +
                 auVar29 * ZEXT816(0x1000003d10);
        uVar84 = auVar1._0_8_;
        (psVar85->x).n[2] = uVar84 & 0xfffffffffffff;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = (uVar84 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar75 & 0xfffffffffffff);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar77 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar63 = auVar30 * ZEXT816(0x1000003d10) + auVar63;
        uVar77 = auVar63._0_8_;
        (psVar85->x).n[3] = uVar77 & 0xfffffffffffff;
        (psVar85->x).n[4] = (uVar77 >> 0x34 | auVar63._8_8_ << 0xc) + (uVar74 & 0xffffffffffff);
        (psVar85->x).magnitude = 1;
        (psVar85->x).normalized = 0;
        secp256k1_fe_verify(&psVar85->x);
        return;
      }
      goto LAB_001187e2;
    }
  }
  else {
    secp256k1_fe_mul_cold_4();
LAB_001187d8:
    secp256k1_fe_mul_cold_3();
  }
  secp256k1_fe_mul_cold_2();
LAB_001187e2:
  secp256k1_fe_mul_cold_1();
  secp256k1_gej_verify(a_02);
  if (a_02->infinity == 0) {
    if (a_01 != (secp256k1_fe *)0x0) {
      uVar64 = (a_02->y).n[0];
      uVar65 = (a_02->y).n[1];
      uVar66 = (a_02->y).n[2];
      uVar67 = (a_02->y).n[3];
      iVar71 = (a_02->y).magnitude;
      iVar72 = (a_02->y).normalized;
      a_01->n[4] = (a_02->y).n[4];
      a_01->magnitude = iVar71;
      a_01->normalized = iVar72;
      a_01->n[2] = uVar66;
      a_01->n[3] = uVar67;
      a_01->n[0] = uVar64;
      a_01->n[1] = uVar65;
      secp256k1_fe_verify(a_01);
      uVar77 = a_01->n[4];
      uVar78 = (uVar77 >> 0x30) * 0x1000003d1 + a_01->n[0];
      uVar84 = (uVar78 >> 0x34) + a_01->n[1];
      uVar79 = (uVar84 >> 0x34) + a_01->n[2];
      uVar81 = (uVar79 >> 0x34) + a_01->n[3];
      a_01->n[0] = uVar78 & 0xfffffffffffff;
      a_01->n[1] = uVar84 & 0xfffffffffffff;
      a_01->n[2] = uVar79 & 0xfffffffffffff;
      a_01->n[3] = uVar81 & 0xfffffffffffff;
      a_01->n[4] = (uVar81 >> 0x34) + (uVar77 & 0xffffffffffff);
      a_01->magnitude = 1;
      secp256k1_fe_verify(a_01);
    }
    secp256k1_gej_double(r,a_02);
    secp256k1_gej_verify(r);
    return;
  }
  secp256k1_gej_set_infinity(r);
  if (a_01 != (secp256k1_fe *)0x0) {
    a_01->n[0] = 1;
    a_01->n[1] = 0;
    a_01->n[2] = 0;
    a_01->n[3] = 0;
    a_01->n[4] = 0;
    a_01->magnitude = 1;
    a_01->normalized = 1;
    secp256k1_fe_verify(a_01);
    return;
  }
  return;
}

Assistant:

static void secp256k1_fe_verify(const secp256k1_fe *a) {
    /* Magnitude between 0 and 32. */
    VERIFY_CHECK((a->magnitude >= 0) && (a->magnitude <= 32));
    /* Normalized is 0 or 1. */
    VERIFY_CHECK((a->normalized == 0) || (a->normalized == 1));
    /* If normalized, magnitude must be 0 or 1. */
    if (a->normalized) VERIFY_CHECK(a->magnitude <= 1);
    /* Invoke implementation-specific checks. */
    secp256k1_fe_impl_verify(a);
}